

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O0

void __thiscall
TPZFYsmpMatrix<std::complex<float>_>::SolveSOR
          (TPZFYsmpMatrix<std::complex<float>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<float>_> *rhs,TPZFMatrix<std::complex<float>_> *x,
          TPZFMatrix<std::complex<float>_> *residual,TPZFMatrix<std::complex<float>_> *param_6,
          REAL overrelax,REAL *tol,int FromCurrent,int direction)

{
  bool bVar1;
  int64_t iVar2;
  complex<float> *pcVar3;
  long *plVar4;
  complex<float> *in_RCX;
  TPZFMatrix<std::complex<float>_> *in_RDX;
  long *in_RSI;
  TPZBaseMatrix *in_RDI;
  long in_R8;
  double in_XMM0_Qa;
  double dVar5;
  double *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int64_t ic;
  complex<float> xnewval;
  int64_t ir;
  complex<float> local_eqres;
  int64_t iteration;
  type_conflict eqres;
  int64_t irInc;
  int64_t irLast;
  int64_t irStart;
  complex<float> *in_stack_ffffffffffffff18;
  complex<float> *in_stack_ffffffffffffff28;
  complex<float> *in_stack_ffffffffffffff30;
  complex<float> *in_stack_ffffffffffffff38;
  TPZFMatrix<std::complex<float>_> *this_00;
  complex<float> local_a0 [4];
  TPZFMatrix<std::complex<float>_> *local_80;
  _ComplexT local_78;
  long local_70;
  complex<float> local_68;
  long local_60;
  float local_54;
  long local_50;
  int64_t local_48;
  long local_40;
  double local_38;
  long local_28;
  complex<float> *local_20;
  TPZFMatrix<std::complex<float>_> *local_18;
  long *local_10;
  
  local_40 = 0;
  local_38 = in_XMM0_Qa;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_48 = TPZBaseMatrix::Rows(in_RDI);
  local_50 = 1;
  if (in_stack_00000018 < 0) {
    iVar2 = TPZBaseMatrix::Rows(in_RDI);
    local_40 = iVar2 + -1;
    local_48 = -1;
    local_50 = -1;
  }
  if (in_stack_00000010 == 0) {
    (**(code **)(local_20->_M_value + 0x78))();
  }
  local_54 = (float)(*in_stack_00000008 * 2.0);
  local_60 = 0;
  while( true ) {
    bVar1 = false;
    if (local_60 < *local_10) {
      bVar1 = *in_stack_00000008 <= (double)local_54;
    }
    if (!bVar1) break;
    std::complex<float>::complex(&local_68,0.0,0.0);
    for (local_70 = local_40; local_70 != local_48; local_70 = local_50 + local_70) {
      pcVar3 = TPZFMatrix<std::complex<float>_>::g(local_18,local_70,0);
      local_78 = pcVar3->_M_value;
      plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 1),local_70);
      local_80 = (TPZFMatrix<std::complex<float>_> *)*plVar4;
      while( true ) {
        this_00 = local_80;
        plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 1),local_70 + 1);
        if (*plVar4 <= (long)this_00) break;
        in_stack_ffffffffffffff38 =
             TPZVec<std::complex<float>_>::operator[]
                       ((TPZVec<std::complex<float>_> *)(in_RDI + 3),(int64_t)local_80);
        in_stack_ffffffffffffff30 = local_20;
        TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 2),(int64_t)local_80);
        TPZFMatrix<std::complex<float>_>::operator()
                  (this_00,(int64_t)in_stack_ffffffffffffff38,(int64_t)in_stack_ffffffffffffff30);
        std::operator*(in_stack_ffffffffffffff18,(complex<float> *)0x14957cd);
        std::complex<float>::operator-=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        local_80 = (TPZFMatrix<std::complex<float>_> *)
                   ((long)&(local_80->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
                           super_TPZSavable._vptr_TPZSavable + 1);
      }
      std::operator*(in_stack_ffffffffffffff18,(complex<float> *)0x1495807);
      std::complex<float>::operator+=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      in_stack_ffffffffffffff28 = local_a0;
      std::complex<float>::complex(in_stack_ffffffffffffff28,(float)local_38,0.0);
      TPZVec<std::complex<float>_>::operator[]
                ((TPZVec<std::complex<float>_> *)(in_RDI + 4),local_70);
      std::operator/(in_stack_ffffffffffffff18,(complex<float> *)0x149585e);
      std::operator*(in_stack_ffffffffffffff18,(complex<float> *)0x1495873);
      TPZFMatrix<std::complex<float>_>::operator()
                (this_00,(int64_t)in_stack_ffffffffffffff38,(int64_t)in_stack_ffffffffffffff30);
      std::complex<float>::operator+=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
    dVar5 = std::sqrt((double)(ulong)(uint)local_54);
    local_54 = SUB84(dVar5,0);
    local_60 = local_60 + 1;
  }
  *in_stack_00000008 = (double)local_54;
  *local_10 = local_60;
  if (local_28 != 0) {
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x28])(in_RDI,local_20,local_18,local_28);
  }
  return;
}

Assistant:

void TPZFYsmpMatrix<TVar>::SolveSOR( int64_t &numiterations, const TPZFMatrix<TVar> &rhs, TPZFMatrix<TVar> &x,
							  TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &/*scratch*/,
							  const REAL overrelax, REAL &tol,
							  const int FromCurrent,const int direction ) {
	
	//    if(!fDiag) ComputeDiagonal();
	int64_t irStart = 0,irLast = this->Rows(),irInc = 1;
	if(direction < 0) {
		irStart = this->Rows()-1;
		irLast = -1;
		irInc = -1;
	}
	if(!FromCurrent) x.Zero();
	RTVar eqres = 2.*tol;
	int64_t iteration;
	for(iteration=0; iteration<numiterations && eqres >= tol; iteration++) {
		TVar local_eqres = 0.;
		int64_t ir=irStart;
		while(ir != irLast) {
			TVar xnewval=rhs.g(ir,0);
			for(int64_t ic=fIA[ir]; ic<fIA[ir+1]; ic++) {
				xnewval -= fA[ic] * x(fJA[ic],0);
			}
			local_eqres += xnewval*xnewval;
			x(ir,0) += (TVar)overrelax*(xnewval/fDiag[ir]);
			ir += irInc;
		}
		eqres = sqrt(eqres);
	}
	tol = eqres;
	numiterations = iteration;
	if(residual) this->Residual(x,rhs,*residual);
}